

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KisteTemplate.h
# Opt level: O0

void __thiscall
kiste::KisteTemplate_t<kiste::terminal_t,_kiste::parse_context,_kiste::cpp>::render_header
          (KisteTemplate_t<kiste::terminal_t,_kiste::parse_context,_kiste::cpp> *this)

{
  KisteTemplate_t<kiste::terminal_t,_kiste::parse_context,_kiste::cpp> *this_local;
  
  cpp::text(this->_serialize,"// generated by kiste2cpp\n#pragma once\n");
  if ((this->data->_report_exceptions & 1U) != 0) {
    cpp::text(this->_serialize,"#include <exception>\n");
  }
  cpp::text(this->_serialize,"#include <kiste/raw_type.h>\n#include <kiste/terminal.h>\n\n");
  if ((this->data->_line_directives & 1U) != 0) {
    cpp::text(this->_serialize,"#line 1 \"");
    cpp::
    escape<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
              (this->_serialize,&this->data->_filename);
    cpp::text(this->_serialize,"\"\n");
  }
  return;
}

Assistant:

void render_header()
    {
    _serialize.text("// generated by kiste2cpp\n"
                    "#pragma once\n");
      if (data._report_exceptions)
      {
      _serialize.text("#include <exception>\n");
      }
    _serialize.text("#include <kiste/raw_type.h>\n"
                    "#include <kiste/terminal.h>\n"
                    "\n");
      if (data._line_directives)
      {
      _serialize.text("#line 1 \"");_serialize.escape(data._filename);_serialize.text("\"\n");
      }
    }